

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void virtual_do_end(dill_stream s,int package)

{
  ssize_t *psVar1;
  char cVar2;
  short sVar3;
  special_operations sVar4;
  short *psVar5;
  vreg_info *pvVar6;
  special_op p_Var7;
  arg_info_list paVar8;
  vreg_info *pvVar9;
  arith_op2 p_Var10;
  ldst_opi p_Var11;
  uint uVar12;
  reg_state *prVar13;
  undefined8 uVar14;
  undefined8 insns;
  dill_stream pdVar15;
  virtual_insn *pvVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  char *pcVar27;
  basic_block_conflict pbVar28;
  bit_vec pbVar29;
  long lVar30;
  basic_block_conflict pbVar31;
  long lVar32;
  void *pvVar33;
  ulong uVar34;
  int *piVar35;
  short *__ptr;
  undefined2 *puVar36;
  short *psVar37;
  jmp_data *pjVar38;
  jmp_table pjVar39;
  int *piVar40;
  dill_exec_handle handle;
  int i;
  uint uVar41;
  long lVar42;
  size_t sVar43;
  long lVar44;
  ulong uVar45;
  private_ctx pdVar46;
  byte bVar47;
  char *pcVar48;
  ulong uVar49;
  virtual_insn *extraout_RDX;
  virtual_insn *extraout_RDX_00;
  virtual_insn *extraout_RDX_01;
  virtual_insn *extraout_RDX_02;
  virtual_insn *extraout_RDX_03;
  virtual_insn *extraout_RDX_04;
  virtual_insn *extraout_RDX_05;
  virtual_insn *extraout_RDX_06;
  virtual_insn *extraout_RDX_07;
  virtual_insn *extraout_RDX_08;
  virtual_insn *extraout_RDX_09;
  virtual_insn *extraout_RDX_10;
  virtual_insn *extraout_RDX_11;
  virtual_insn *extraout_RDX_12;
  virtual_insn *extraout_RDX_13;
  virtual_insn *extraout_RDX_14;
  virtual_insn *extraout_RDX_15;
  virtual_insn *extraout_RDX_16;
  virtual_insn *extraout_RDX_17;
  virtual_insn *extraout_RDX_18;
  virtual_insn *extraout_RDX_19;
  virtual_insn *extraout_RDX_20;
  virtual_insn *extraout_RDX_21;
  virtual_insn *extraout_RDX_22;
  virtual_insn *extraout_RDX_23;
  virtual_insn *pvVar50;
  virtual_insn *extraout_RDX_24;
  virtual_insn *extraout_RDX_25;
  virtual_insn *pvVar51;
  virtual_insn *extraout_RDX_26;
  virtual_insn *extraout_RDX_27;
  virtual_insn *extraout_RDX_28;
  virtual_insn *extraout_RDX_29;
  virtual_insn *extraout_RDX_30;
  virtual_insn *extraout_RDX_31;
  virtual_insn *pvVar52;
  private_ctx pdVar53;
  code *info_ptr;
  unsigned_long uVar54;
  int *piVar55;
  int *piVar56;
  byte bVar57;
  long lVar58;
  reg_state *prVar59;
  basic_block *bb;
  byte bVar60;
  uint *puVar61;
  arith_op3 *pp_Var62;
  uint uVar63;
  uint uVar64;
  size_t __n;
  virtual_mach_info pmVar65;
  ulong uVar66;
  bool bVar67;
  int dtmpa;
  int itmpa;
  int itmpb;
  undefined1 local_ec [48];
  uint local_bc;
  long local_b8;
  int *local_b0;
  reg_state local_a8;
  int local_6c;
  uint local_68 [6];
  ulong local_50;
  int *local_48;
  long local_40;
  int local_38;
  uint local_34;
  
  pdVar53 = s->p;
  pmVar65 = (virtual_mach_info)pdVar53->mach_info;
  local_ec._36_8_ = pdVar53->code_base;
  pvVar52 = (virtual_insn *)pdVar53->cur_ip;
  iVar17 = pmVar65->prefix_code_start;
  pvVar50 = (virtual_insn *)(local_ec._36_8_ + (long)iVar17 * 0x28);
  iVar26 = s->dill_local_pointer;
  local_6c = package;
  if (virtual_do_end::dill_verbose == -1) {
    pcVar27 = getenv("DILL_VERBOSE");
    virtual_do_end::dill_verbose = (int)(pcVar27 != (char *)0x0);
    pcVar27 = getenv("DILL_NOOPTIMIZE");
    virtual_do_end::no_optimize = (int)(pcVar27 != (char *)0x0);
    pcVar27 = getenv("DILL_OLD_REGS");
    virtual_do_end::old_reg_alloc = (int)(pcVar27 != (char *)0x0);
    pcVar27 = getenv("DILL_DO_EMULATION");
    virtual_do_end::do_emulation = (int)(pcVar27 != (char *)0x0);
  }
  (pdVar53->virtual).code_base = (char *)local_ec._36_8_;
  if (iVar17 == -1) {
    pvVar50 = pvVar52;
  }
  pmVar65->bbcount = 0;
  pbVar28 = (basic_block_conflict)dill_malloc(0x68);
  pmVar65->bblist = pbVar28;
  pbVar28->start = 0;
  pbVar28->label = -1;
  iVar17 = s->p->vreg_count + 7 >> 3;
  local_ec._20_8_ = pmVar65;
  pbVar29 = (bit_vec)dill_malloc((long)iVar17 + 2);
  pbVar29->len = (short)iVar17;
  memset(pbVar29->vec,0,(long)iVar17);
  pbVar28->regs_used = pbVar29;
  iVar17 = s->p->vreg_count + 7 >> 3;
  pbVar29 = (bit_vec)dill_malloc((long)iVar17 + 2);
  pbVar29->len = (short)iVar17;
  memset(pbVar29->vec,0,(long)iVar17);
  uVar14 = local_ec._36_8_;
  pbVar28->regs_defined = pbVar29;
  pbVar28->reg_assigns = (short *)0x0;
  pbVar28->end_branch_label = -1;
  pbVar28->fall_through = 0;
  pbVar28->is_loop_start = 0;
  pbVar28->is_loop_end = 0;
  if (pvVar50 < pvVar52) {
    uVar66 = (ulong)((long)pvVar50 - local_ec._36_8_) / 0x28;
    pbVar28->start = uVar66;
    pmVar65 = (virtual_mach_info)local_ec._20_8_;
    for (pvVar51 = (virtual_insn *)(local_ec._36_8_ + uVar66 * 0x28); local_ec._20_8_ = pmVar65,
        pvVar51 < pvVar52; pvVar51 = pvVar51 + 1) {
      uVar66 = uVar66 + 1;
      build_bb_body(s,pvVar51,(int)uVar66,(virtual_insn *)uVar14);
      pmVar65 = (virtual_mach_info)local_ec._20_8_;
    }
    pbVar28 = pmVar65->bblist;
    iVar17 = pmVar65->bbcount;
    lVar30 = (long)iVar17;
    pbVar28[lVar30].end_branch_label = -1;
    pbVar28[lVar30].fall_through = 1;
    pbVar28[lVar30].end = uVar66 - 1;
    pmVar65->bbcount = iVar17 + 1;
    pbVar31 = (basic_block_conflict)dill_realloc(pbVar28,lVar30 * 0x68 + 0xd0);
    pmVar65->bblist = pbVar31;
    iVar17 = pmVar65->bbcount;
    pbVar28 = pbVar31 + iVar17;
    pbVar31[iVar17].start = uVar66;
    psVar1 = &pbVar31[iVar17].end;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
    *(int *)(psVar1 + 1) = -1;
    *(int *)((long)psVar1 + 0xc) = -1;
    pbVar31[iVar17].fall_through = 0;
    pbVar31[iVar17].is_loop_start = 0;
    pbVar31[iVar17].is_loop_end = 0;
    iVar18 = s->p->vreg_count + 7 >> 3;
    pbVar29 = (bit_vec)dill_malloc((long)iVar18 + 2);
    pbVar29->len = (short)iVar18;
    memset(pbVar29->vec,0,(long)iVar18);
    pbVar31[iVar17].regs_used = pbVar29;
    iVar18 = s->p->vreg_count + 7 >> 3;
    pbVar29 = (bit_vec)dill_malloc((long)iVar18 + 2);
    pbVar29->len = (short)iVar18;
    memset(pbVar29->vec,0,(long)iVar18);
    pbVar31[iVar17].regs_defined = pbVar29;
  }
  insns = local_ec._36_8_;
  uVar14 = local_ec._20_8_;
  pbVar28->start = 0;
  lVar30 = 1;
  pvVar52 = (virtual_insn *)local_ec._36_8_;
  if ((ulong)local_ec._36_8_ < pvVar50) {
    do {
      lVar32 = lVar30;
      build_bb_body(s,pvVar52,(int)lVar32,(virtual_insn *)insns);
      lVar30 = lVar32 + 1;
      pvVar52 = pvVar52 + 1;
    } while (pvVar52 < pvVar50);
  }
  else {
    lVar32 = 0;
  }
  pbVar28 = *(basic_block_conflict *)(uVar14 + 0x10);
  iVar17 = *(int *)(uVar14 + 8);
  lVar42 = (long)iVar17;
  pbVar28[lVar42].end_branch_label = -1;
  pbVar28[lVar42].fall_through = 0;
  pbVar28[lVar42].end = lVar32;
  *(int *)(uVar14 + 8) = iVar17 + 1;
  pbVar28 = (basic_block_conflict)dill_realloc(pbVar28,lVar42 * 0x68 + 0xd0);
  *(basic_block_conflict *)(uVar14 + 0x10) = pbVar28;
  lVar32 = (long)*(int *)(uVar14 + 8);
  pbVar28[lVar32].start = lVar30;
  psVar1 = &pbVar28[lVar32].end;
  *(undefined4 *)psVar1 = 0xffffffff;
  *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
  *(int *)(psVar1 + 1) = -1;
  *(int *)((long)psVar1 + 0xc) = -1;
  pbVar28[lVar32].fall_through = 0;
  pbVar28[lVar32].is_loop_start = 0;
  pbVar28[lVar32].is_loop_end = 0;
  iVar17 = s->p->vreg_count + 7 >> 3;
  pbVar29 = (bit_vec)dill_malloc((long)iVar17 + 2);
  pbVar29->len = (short)iVar17;
  memset(pbVar29->vec,0,(long)iVar17);
  pbVar28[lVar32].regs_used = pbVar29;
  iVar17 = s->p->vreg_count + 7 >> 3;
  pbVar29 = (bit_vec)dill_malloc((long)iVar17 + 2);
  pbVar29->len = (short)iVar17;
  memset(pbVar29->vec,0,(long)iVar17);
  pbVar28[lVar32].regs_defined = pbVar29;
  free(pbVar28[lVar32].regs_used);
  free(pbVar28[lVar32].regs_defined);
  uVar14 = local_ec._20_8_;
  pbVar28[lVar32 + -1].end = pbVar28[lVar32 + -1].end + -1;
  if (*(int *)(local_ec._20_8_ + 8) != 0) {
    lVar30 = 0x1c;
    uVar66 = 0;
    do {
      pbVar28 = *(basic_block_conflict *)(uVar14 + 0x10);
      *(undefined4 *)((long)&pbVar28->end + lVar30 + 4) = 0;
      *(undefined4 *)((long)&pbVar28->start + lVar30) = 0;
      pvVar33 = dill_malloc(8);
      *(void **)((long)&pbVar28->end_branch_label + lVar30) = pvVar33;
      pvVar33 = dill_malloc(4);
      *(void **)((long)&pbVar28->start + lVar30 + 4) = pvVar33;
      *(undefined8 *)((long)&pbVar28->succ_list + lVar30 + 4) = 0;
      uVar66 = uVar66 + 1;
      uVar34 = (ulong)*(int *)(uVar14 + 8);
      lVar30 = lVar30 + 0x68;
    } while (uVar66 < uVar34);
    if (*(int *)(uVar14 + 8) != 0) {
      uVar66 = 0;
      do {
        pbVar28 = *(basic_block_conflict *)(uVar14 + 0x10);
        iVar17 = (int)uVar66;
        if (pbVar28[uVar66].fall_through != 0) {
          pbVar28[uVar66].succ_list[pbVar28[uVar66].succ_count] = iVar17 + 1;
          pbVar28[uVar66].succ_count = pbVar28[uVar66].succ_count + 1;
          piVar35 = (int *)dill_realloc(pbVar28[uVar66 + 1].pred_list,
                                        (long)pbVar28[uVar66 + 1].pred_count * 4 + 4);
          pbVar28[uVar66 + 1].pred_list = piVar35;
          piVar35[pbVar28[uVar66 + 1].pred_count] = iVar17;
          pbVar28[uVar66 + 1].pred_count = pbVar28[uVar66 + 1].pred_count + 1;
          uVar34 = (ulong)(uint)*(int *)(uVar14 + 8);
        }
        if ((pbVar28[uVar66].end_branch_label != -1) && (0 < (int)uVar34)) {
          uVar41 = 0;
          do {
            pbVar31 = *(basic_block_conflict *)(uVar14 + 0x10);
            if (pbVar31[(int)uVar41].label == pbVar28[uVar66].end_branch_label) {
              pbVar28[uVar66].succ_list[pbVar28[uVar66].succ_count] = uVar41;
              pbVar28[uVar66].succ_count = pbVar28[uVar66].succ_count + 1;
              piVar35 = (int *)dill_realloc(pbVar31[(int)uVar41].pred_list,
                                            (long)pbVar31[(int)uVar41].pred_count * 4 + 4);
              pbVar31[(int)uVar41].pred_list = piVar35;
              piVar35[pbVar31[(int)uVar41].pred_count] = iVar17;
              pbVar31[(int)uVar41].pred_count = pbVar31[(int)uVar41].pred_count + 1;
              uVar41 = *(int *)(uVar14 + 8);
              uVar34 = (ulong)uVar41;
            }
            uVar41 = uVar41 + 1;
          } while ((int)uVar41 < (int)uVar34);
        }
        uVar66 = uVar66 + 1;
      } while (uVar66 < (ulong)(long)(int)uVar34);
    }
  }
  pvVar33 = s->p->mach_info;
  iVar17 = s->p->vreg_count + 7 >> 3;
  __ptr = (short *)dill_malloc((long)iVar17 + 2);
  *__ptr = (short)iVar17;
  psVar37 = __ptr + 1;
  memset(psVar37,0,(long)iVar17);
  uVar66 = (ulong)*(uint *)((long)pvVar33 + 8);
  if (0 < (int)*(uint *)((long)pvVar33 + 8)) {
    lVar32 = 0x48;
    lVar30 = 0;
    do {
      local_ec._28_8_ = *(ulong *)((long)pvVar33 + 0x10);
      iVar17 = s->p->vreg_count + 7 >> 3;
      puVar36 = (undefined2 *)dill_malloc((long)iVar17 + 2);
      *puVar36 = (short)iVar17;
      memset(puVar36 + 1,0,(long)iVar17);
      *(undefined2 **)((char *)local_ec._28_8_ + lVar32) = puVar36;
      lVar30 = lVar30 + 1;
      uVar66 = (ulong)*(int *)((long)pvVar33 + 8);
      lVar32 = lVar32 + 0x68;
    } while (lVar30 < (long)uVar66);
    if (0 < *(int *)((long)pvVar33 + 8)) {
      lVar30 = 0;
      do {
        iVar17 = *(int *)(*(long *)((long)pvVar33 + 0x10) + 0x1c + lVar30 * 0x68);
        if (0 < iVar17) {
          lVar42 = *(long *)((long)pvVar33 + 0x10) + lVar30 * 0x68;
          lVar32 = 0;
          do {
            psVar5 = *(short **)
                      (*(long *)((long)pvVar33 + 0x10) + 0x48 +
                      (long)*(int *)(*(long *)(lVar42 + 0x20) + lVar32 * 4) * 0x68);
            sVar3 = *psVar5;
            if (0 < (long)sVar3) {
              lVar44 = *(long *)(lVar42 + 0x38);
              lVar58 = 0;
              do {
                bVar47 = *(byte *)((long)psVar5 + lVar58 + 2);
                bVar60 = *(byte *)(lVar44 + 2 + lVar58) | bVar47;
                if (bVar60 != bVar47) {
                  *(byte *)((long)psVar5 + lVar58 + 2) = bVar60;
                }
                lVar58 = lVar58 + 1;
              } while (sVar3 != lVar58);
              iVar17 = *(int *)(lVar42 + 0x1c);
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 < iVar17);
          uVar66 = (ulong)*(uint *)((long)pvVar33 + 8);
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 < (int)uVar66);
    }
  }
  do {
    if ((int)uVar66 < 1) break;
    lVar30 = 0;
    bVar67 = false;
    do {
      lVar32 = lVar30 * 0x68 + *(long *)((long)pvVar33 + 0x10);
      __n = (size_t)*__ptr;
      memset(psVar37,0,__n);
      if (0 < (long)__n) {
        lVar42 = *(long *)(lVar32 + 0x48);
        sVar43 = 0;
        do {
          bVar47 = *(byte *)(lVar42 + 2 + sVar43) | *(byte *)((long)psVar37 + sVar43);
          if (bVar47 != *(byte *)((long)psVar37 + sVar43)) {
            *(byte *)((long)psVar37 + sVar43) = bVar47;
          }
          sVar43 = sVar43 + 1;
        } while (__n != sVar43);
        lVar42 = *(long *)(lVar32 + 0x40);
        sVar43 = 0;
        do {
          *(byte *)((long)psVar37 + sVar43) =
               *(byte *)((long)psVar37 + sVar43) & ~*(byte *)(lVar42 + 2 + sVar43);
          sVar43 = sVar43 + 1;
        } while (__n != sVar43);
      }
      iVar17 = *(int *)(lVar32 + 0x1c);
      if (0 < iVar17) {
        lVar42 = 0;
        do {
          psVar5 = *(short **)
                    (*(long *)((long)pvVar33 + 0x10) + 0x48 +
                    (long)*(int *)(*(long *)(lVar32 + 0x20) + lVar42 * 4) * 0x68);
          sVar3 = *psVar5;
          if ((long)sVar3 < 1) {
            bVar47 = 0;
          }
          else {
            lVar44 = 0;
            bVar47 = 0;
            do {
              bVar60 = *(byte *)((long)psVar5 + lVar44 + 2);
              bVar57 = *(byte *)((long)psVar37 + lVar44) | bVar60;
              if (bVar57 != bVar60) {
                *(byte *)((long)psVar5 + lVar44 + 2) = bVar57;
                bVar47 = 1;
              }
              lVar44 = lVar44 + 1;
            } while (sVar3 != lVar44);
            iVar17 = *(int *)(lVar32 + 0x1c);
          }
          bVar67 = (bool)(bVar67 | bVar47);
          lVar42 = lVar42 + 1;
        } while (lVar42 < iVar17);
      }
      lVar30 = lVar30 + 1;
      uVar66 = (ulong)*(int *)((long)pvVar33 + 8);
    } while (lVar30 < (long)uVar66);
  } while (bVar67);
  free(__ptr);
  pmVar65 = (virtual_mach_info)local_ec._20_8_;
  if (virtual_do_end::no_optimize == 0) {
    if (count_verbose == -1) {
      pcVar27 = getenv("DILL_COUNTS");
      count_verbose = (int)(pcVar27 != (char *)0x0);
    }
    if (count_verbose == 1) {
      pcVar27 = s->p->code_base;
      pcVar48 = s->p->cur_ip;
      uVar66 = 0;
      if (pcVar27 < pcVar48) {
        uVar66 = 0;
        do {
          uVar66 = (ulong)((int)uVar66 + (uint)(*pcVar27 != '\x18'));
          pcVar27 = pcVar27 + 0x28;
        } while (pcVar27 < pcVar48);
      }
      printf("Prior to optimization, %d non-null virtual insns\n",uVar66);
    }
    apply_to_each(s,(void *)local_ec._36_8_,pmVar65,do_const_prop);
    if (count_verbose == 1) {
      pcVar27 = s->p->code_base;
      pcVar48 = s->p->cur_ip;
      uVar66 = 0;
      if (pcVar27 < pcVar48) {
        uVar66 = 0;
        do {
          uVar66 = (ulong)((int)uVar66 + (uint)(*pcVar27 != '\x18'));
          pcVar27 = pcVar27 + 0x28;
        } while (pcVar27 < pcVar48);
      }
      printf("After constant propagation, %d non-null virtual insns\n",uVar66);
    }
    apply_to_each(s,(void *)local_ec._36_8_,pmVar65,do_com_sub_exp);
    if (count_verbose == 1) {
      for (pcVar27 = s->p->code_base; pcVar27 < s->p->cur_ip; pcVar27 = pcVar27 + 0x28) {
      }
      printf("After duplicate instruction elimination (CSE-lite), %d non-null virtual insns\n");
    }
    uVar14 = local_ec._36_8_;
    pdVar53 = s->p;
    iVar17 = pdVar53->vreg_count;
    if (0 < (long)iVar17) {
      pvVar6 = pdVar53->vregs;
      lVar30 = 0;
      do {
        *(undefined4 *)((long)&(pvVar6->use_info).use_count + lVar30) = 0;
        lVar30 = lVar30 + 0x2c;
      } while ((long)iVar17 * 0x2c - lVar30 != 0);
    }
    iVar17 = pdVar53->c_param_count;
    if (0 < (long)iVar17) {
      paVar8 = pdVar53->c_param_args;
      lVar30 = 0;
      do {
        *(undefined4 *)((long)&paVar8->used + lVar30) = 0;
        lVar30 = lVar30 + 0x14;
      } while ((long)iVar17 * 0x14 != lVar30);
    }
    apply_to_each(s,(void *)local_ec._36_8_,pmVar65,do_use_def_count);
    apply_to_each(s,(void *)uVar14,pmVar65,kill_dead);
    pdVar53 = s->p;
    if (0 < pdVar53->c_param_count) {
      uVar41 = pdVar53->c_param_count;
      do {
        if (pdVar53->c_param_args[(ulong)uVar41 - 1].used != 0) break;
        pdVar53->c_param_count = uVar41 - 1;
        bVar67 = 1 < (int)uVar41;
        uVar41 = uVar41 - 1;
      } while (bVar67);
    }
  }
  else {
    pdVar53 = s->p;
  }
  if (virtual_do_end::dill_verbose != 0) {
    pvVar33 = pdVar53->mach_info;
    if (0 < *(int *)((long)pvVar33 + 8)) {
      lVar32 = 0;
      lVar30 = 0;
      do {
        dump_bb(s,(basic_block *)(*(long *)((long)pvVar33 + 0x10) + lVar32),(int)lVar30);
        lVar30 = lVar30 + 1;
        lVar32 = lVar32 + 0x68;
      } while (lVar30 < *(int *)((long)pvVar33 + 8));
      pdVar53 = s->p;
    }
    s->dill_debug = 1;
  }
  (pdVar53->virtual).mach_jump = s->j;
  (pdVar53->virtual).mach_reset = pdVar53->mach_reset;
  (pdVar53->virtual).mach_info = pdVar53->mach_info;
  pvVar50 = (virtual_insn *)pdVar53->code_base;
  pvVar52 = (virtual_insn *)pdVar53->cur_ip;
  (pdVar53->virtual).code_base = (char *)pvVar50;
  (pdVar53->virtual).cur_ip = (char *)pvVar52;
  (pdVar53->virtual).code_limit = pdVar53->code_limit;
  if (virtual_do_end::do_emulation == 0) {
    if (dill_foreign_cg != (dill_foreign_cg_func)0x0) {
      (*dill_foreign_cg)(s,pvVar50,pvVar52);
      goto LAB_0010dadb;
    }
    s->j = (pdVar53->native).mach_jump;
    pvVar33 = (pdVar53->native).mach_info;
    pdVar53->mach_reset = (pdVar53->native).mach_reset;
    pdVar53->mach_info = pvVar33;
    pcVar27 = (pdVar53->native).code_base;
    pdVar53->code_base = pcVar27;
    (pdVar53->native).mach_info = (void *)0x0;
    (pdVar53->native).code_base = (char *)0x0;
    if (pcVar27 == (char *)0x0) {
      init_code_block(s);
      pdVar53 = s->p;
      pcVar27 = pdVar53->code_base;
      pcVar48 = pdVar53->code_limit;
      (pdVar53->native).code_base = pcVar27;
      (pdVar53->native).code_limit = pcVar48;
    }
    else {
      pcVar48 = (pdVar53->native).code_limit;
    }
    pdVar53->cur_ip = pcVar27;
    pdVar53->code_limit = pcVar48;
    (*pdVar53->native_mach_reset)(s);
    uVar66 = (ulong)(s->p->branch_table).next_label;
    piVar35 = (int *)dill_malloc(uVar66 * 0xc + 0xc);
    if (0 < (long)uVar66) {
      piVar56 = (s->p->branch_table).label_locs;
      piVar40 = piVar35 + 1;
      uVar34 = 0;
      do {
        *piVar40 = (int)uVar34;
        piVar40[-1] = piVar56[uVar34];
        uVar34 = uVar34 + 1;
        piVar40 = piVar40 + 3;
      } while (uVar66 != uVar34);
      uVar45 = 1;
      uVar34 = 0;
      piVar40 = piVar35;
      do {
        piVar40 = piVar40 + 3;
        uVar49 = uVar34 + 1;
        if (uVar49 < uVar66) {
          piVar56 = piVar35 + uVar34 * 3;
          piVar55 = piVar40;
          uVar34 = uVar66;
          do {
            if (*piVar55 < *piVar56) {
              iVar17 = piVar56[2];
              local_a8.bb = (basic_block_conflict)CONCAT44(local_a8.bb._4_4_,iVar17);
              local_a8.c = *(dill_stream *)piVar56;
              piVar56[2] = piVar55[2];
              *(undefined8 *)piVar56 = *(undefined8 *)piVar55;
              piVar55[2] = iVar17;
              *(dill_stream *)piVar55 = local_a8.c;
            }
            uVar34 = uVar34 - 1;
            piVar55 = piVar55 + 3;
          } while (uVar45 != uVar34);
        }
        uVar45 = uVar45 + 1;
        uVar34 = uVar49;
      } while (uVar49 != uVar66);
    }
    (piVar35 + uVar66 * 3)[0] = -1;
    (piVar35 + uVar66 * 3)[1] = -1;
    piVar35[uVar66 * 3 + 2] = -1;
    (*s->j->proc_start)(s,"no name",s->p->c_param_count,*&pmVar65->arg_info,(dill_reg *)0x0);
    if (piVar35[1] != -1) {
      piVar40 = piVar35 + 4;
      do {
        iVar17 = dill_alloc_label(s,(char *)0x0);
        piVar40[-2] = iVar17;
        iVar17 = *piVar40;
        piVar40 = piVar40 + 3;
      } while (iVar17 != -1);
    }
    if (virtual_do_end::old_reg_alloc == 0) {
      if (count_verbose == -1) {
        pcVar27 = getenv("DILL_COUNTS");
        count_verbose = (int)(pcVar27 != (char *)0x0);
      }
      local_a8.fpregs = (preg_info *)dill_malloc(4);
      local_a8.ipregs = (preg_info *)dill_malloc(4);
      local_a8.reg_count = 0;
      local_a8.ret_reg = -1;
      local_a8.ret_vreg = 0xffffffff;
      local_a8.param_info = (vreg_info *)dill_malloc((long)s->p->c_param_count * 0x2c);
      pdVar53 = s->p;
      iVar17 = pdVar53->c_param_count;
      if (0 < (long)iVar17) {
        paVar8 = pdVar53->c_param_args;
        piVar40 = &(local_a8.param_info)->value_in_mem;
        lVar30 = 0;
        do {
          bVar67 = (&paVar8->is_register)[lVar30] == '\0';
          if (bVar67) {
            uVar41 = 0xffffffff;
          }
          else {
            uVar41 = *(uint *)((long)&paVar8->in_reg + lVar30);
          }
          piVar40[-1] = 0;
          *piVar40 = (uint)bVar67;
          piVar40[-4] = uVar41;
          lVar30 = lVar30 + 0x14;
          piVar40 = piVar40 + 0xb;
        } while ((long)iVar17 * 0x14 != lVar30);
      }
      uVar41 = 0;
      local_a8.c = s;
      if (pdVar53->vreg_count == 0) {
        pvVar50 = (virtual_insn *)0x0;
      }
      else {
        lVar30 = 8;
        pvVar50 = (virtual_insn *)0x0;
        do {
          iVar17 = dill_type_of(s,(int)pvVar50 + 100);
          pdVar53 = s->p;
          if (iVar17 == 0xc) {
            iVar17 = (*s->j->local)(s,1,*(int *)((long)&pdVar53->vregs->typ + lVar30));
            pdVar53 = s->p;
            *(int *)((long)&pdVar53->vregs->typ + lVar30) = iVar17;
          }
          pvVar50 = (virtual_insn *)((long)pvVar50 + 1);
          lVar30 = lVar30 + 0x2c;
        } while (pvVar50 < (ulong)(long)pdVar53->vreg_count);
      }
      if (*(int *)(local_ec._20_8_ + 8) != 0) {
        local_b0 = piVar35 + 4;
        uVar41 = 0;
        uVar66 = 0;
        do {
          pvVar6 = local_a8.param_info;
          pdVar15 = local_a8.c;
          pbVar28 = *(basic_block_conflict *)(local_ec._20_8_ + 0x10);
          pvVar50 = (virtual_insn *)pbVar28[uVar66].start;
          pvVar52 = (virtual_insn *)pbVar28[uVar66].end;
          pdVar53 = s->p;
          iVar17 = pdVar53->vreg_count;
          lVar30 = (long)iVar17;
          if (lVar30 != 0) {
            piVar40 = &pdVar53->vregs->value_in_mem;
            lVar32 = lVar30;
            do {
              *(undefined8 *)(piVar40 + -5) = 0xffffffffffffffff;
              *(undefined8 *)(piVar40 + -3) = 0xffffffff;
              *(undefined8 *)(piVar40 + -1) = 0xffffffff00000000;
              piVar40 = piVar40 + 0xb;
              lVar32 = lVar32 + -1;
            } while (lVar32 != 0);
          }
          lVar32 = (long)pdVar53->c_param_count;
          if (lVar32 != 0) {
            piVar40 = &(local_a8.param_info)->value_in_mem;
            do {
              *(undefined8 *)(piVar40 + -5) = 0xffffffffffffffff;
              *(undefined8 *)(piVar40 + -3) = 0xffffffff;
              *(undefined8 *)(piVar40 + -1) = 0xffffffff00000000;
              piVar40 = piVar40 + 0xb;
              lVar32 = lVar32 + -1;
            } while (lVar32 != 0);
          }
          bb = pbVar28 + uVar66;
          pvVar51 = pvVar52;
          pvVar16 = pvVar50;
          local_50 = uVar66;
          if (pvVar50 <= pvVar52) {
            do {
              local_ec._28_8_ = pvVar16;
              pvVar51 = (virtual_insn *)(local_ec._36_8_ + pvVar50 * 0x28);
              insn_uses(pvVar51,(int *)local_68);
              local_68[3] = insn_defines(pvVar51);
              lVar30 = 0;
              do {
                uVar19 = local_68[lVar30];
                uVar66 = (ulong)uVar19;
                if (uVar66 != 0xffffffff) {
                  pdVar53 = pdVar15->p;
                  iVar17 = (int)pvVar50;
                  if (lVar30 != 3) {
                    if ((int)uVar19 < 100) {
                      if (pdVar53->c_param_args[(int)uVar19].is_register != '\0') goto LAB_0010fdb9;
                      pvVar9 = pvVar6 + (int)uVar19;
                    }
                    else {
                      pvVar9 = pdVar53->vregs + (uVar66 - 100);
                    }
                    pvVar9->last_use = iVar17;
                  }
                  if ((int)uVar19 < 100) {
                    if (pdVar53->c_param_args[(int)uVar19].is_register != '\0') goto LAB_0010fdb9;
                    if (pvVar6[(int)uVar19].value_in_mem == -1) {
                      pvVar6[(int)uVar19].value_in_mem = iVar17;
                    }
                    pvVar9 = pvVar6 + (int)uVar19;
                  }
                  else {
                    pvVar9 = pdVar53->vregs;
                    if (pvVar9[uVar66 - 100].value_in_mem == -1) {
                      pvVar9[uVar66 - 100].value_in_mem = iVar17;
                    }
                    pvVar9 = pvVar9 + (uVar66 - 100);
                  }
                  pvVar9->use_metric = pvVar9->use_metric + 1;
                }
LAB_0010fdb9:
                lVar30 = lVar30 + 1;
              } while (lVar30 != 4);
              pvVar50 = (virtual_insn *)&pvVar50->insn_code;
              pvVar51 = (virtual_insn *)bb->end;
              pvVar16 = (virtual_insn *)local_ec._28_8_;
            } while (pvVar50 <= pvVar51);
            pdVar53 = s->p;
            iVar17 = pdVar53->vreg_count;
            lVar30 = (long)iVar17;
            pvVar50 = (virtual_insn *)local_ec._28_8_;
          }
          uVar66 = local_50;
          uVar19 = (int)pvVar52 - (int)pvVar50;
          if (iVar17 != 0) {
            pdVar46 = (local_a8.c)->p;
            lVar32 = 0x28;
            lVar42 = 0;
            do {
              uVar25 = (uint)lVar42;
              iVar17 = (int)(lVar42 + 100U);
              if ((int)uVar25 < 0) {
                if (pdVar46->c_param_args[iVar17].is_register == '\0') {
                  pvVar6 = local_a8.param_info + iVar17;
                  goto LAB_0010fe45;
                }
LAB_0010fe60:
                pvVar6 = pdVar53->vregs;
                *(int *)((long)pvVar6 + lVar32 + -8) =
                     (int)(*(int *)((long)pvVar6 + lVar32 + -8) * uVar19) /
                     ((*(int *)((long)pvVar6 + lVar32 + -0xc) -
                      *(int *)((long)&pvVar6->typ + lVar32)) + 1);
                *(uint *)((long)&pvVar6->typ + lVar32) =
                     (uint)(((uint)(int)bb->regs_used->vec[(int)uVar25 >> 3] >> (uVar25 & 7) & 1) !=
                           0);
              }
              else {
                pvVar6 = pdVar46->vregs + ((lVar42 + 100U & 0xffffffff) - 100);
LAB_0010fe45:
                if (pvVar6->last_use != -1) goto LAB_0010fe60;
              }
              lVar42 = lVar42 + 1;
              lVar32 = lVar32 + 0x2c;
            } while (lVar30 != lVar42);
          }
          lVar30 = (long)pdVar53->c_param_count;
          if (lVar30 != 0) {
            piVar56 = &(local_a8.param_info)->value_in_mem;
            piVar40 = &pdVar53->c_param_args->in_reg;
            do {
              bVar67 = *(char *)((long)piVar40 + -3) == '\0';
              if (bVar67) {
                uVar25 = 0xffffffff;
              }
              else {
                uVar25 = *piVar40;
              }
              piVar56[-1] = 0;
              *piVar56 = (uint)bVar67;
              piVar56[-4] = uVar25;
              piVar56 = piVar56 + 0xb;
              piVar40 = piVar40 + 5;
              lVar30 = lVar30 + -1;
            } while (lVar30 != 0);
          }
          if (0 < (long)local_a8.reg_count) {
            lVar30 = 0;
            do {
              local_a8.ipregs[lVar30].holds = -1;
              local_a8.fpregs[lVar30].holds = -1;
              lVar30 = lVar30 + 1;
            } while (local_a8.reg_count != lVar30);
          }
          if (s->dill_debug != 0) {
            printf("============= Starting basic block %zd ===========\n",local_50);
            dump_bb(s,bb,(int)uVar66);
            pdVar53 = s->p;
            pvVar51 = (virtual_insn *)bb->end;
          }
          local_40 = CONCAT44(local_40._4_4_,*(int *)&pdVar53->cur_ip - *(int *)&pdVar53->code_base)
          ;
          pvVar50 = (virtual_insn *)bb->start;
          if (pvVar50 <= pvVar51) {
            do {
              local_ec._12_8_ =
                   SEXT18(((virtual_insn *)(local_ec._36_8_ + pvVar50 * 0x28))->insn_code);
              iVar17 = (int)pvVar50;
              uVar25 = iVar17 * 0x28;
              local_a8.bb = bb;
              if (piVar35[(long)(int)uVar41 * 3] == uVar25) {
                puVar61 = (uint *)(piVar35 + (long)(int)uVar41 * 3 + 3);
                do {
                  dill_mark_label(s,puVar61[-1]);
                  uVar41 = uVar41 + 1;
                  uVar63 = *puVar61;
                  puVar61 = puVar61 + 3;
                } while (uVar63 == uVar25);
              }
              pvVar52 = (virtual_insn *)(local_ec._36_8_ + pvVar50 * 0x28);
              if (s->dill_debug != 0) {
                pvVar33 = (void *)(ulong)uVar25;
                printf("   v    loc(%d)  ");
                virtual_print_insn(s,pvVar33,pvVar52);
                putchar(10);
              }
              if (pvVar50 == (virtual_insn *)bb->end) {
                spill_current_pregs(&local_a8);
              }
              insn_uses(pvVar52,(int *)local_68);
              iVar26 = insn_defines(pvVar52);
              local_ec._28_4_ = iVar26;
              lVar30 = (long)local_a8.ret_vreg;
              pvVar51 = extraout_RDX_25;
              if (lVar30 != -1) {
                pvVar6 = s->p->vregs;
                pvVar51 = (virtual_insn *)(long)pvVar6[lVar30 + -100].last_use;
                if (pvVar50 == pvVar51) {
                  pvVar6[lVar30 + -100].in_reg = local_a8.ret_reg;
                }
                else {
                  iVar26 = select_reg(&local_a8,local_a8.ret_vreg,iVar17,0);
                  p_Var10 = s->j->mov;
                  iVar18 = dill_type_of(s,local_a8.ret_vreg);
                  (*p_Var10)(s,iVar18,0,iVar26,local_a8.ret_reg);
                  pvVar51 = extraout_RDX_26;
                }
                local_a8.ret_vreg = 0xffffffff;
              }
              lVar30 = 0;
              do {
                if (local_68[lVar30] == 0xffffffff) break;
                iVar26 = select_reg(&local_a8,local_68[lVar30],iVar17,1);
                *(int *)(local_ec + lVar30 * 4) = iVar26;
                lVar30 = lVar30 + 1;
                pvVar51 = extraout_RDX_27;
              } while (lVar30 != 3);
              uVar14 = local_ec._28_8_;
              uVar25 = local_ec._28_4_;
              if (local_ec._28_4_ == 0xffffffff) {
                iVar17 = -1;
              }
              else {
                iVar17 = select_reg(&local_a8,local_ec._28_4_,iVar17,0);
                pvVar51 = extraout_RDX_28;
              }
              if ((s->dill_debug != 0) && ((uVar25 != 0xffffffff || (local_68[0] != 0xffffffff)))) {
                printf("\tvregs\t\t");
                if (uVar25 != 0xffffffff) {
                  uVar66 = 0x50;
                  if (99 < (int)uVar25) {
                    iVar26 = dill_type_of(s,uVar25);
                    uVar66 = (ulong)((uint)(iVar26 != 0xc) << 4 | 0x42);
                  }
                  printf(" %c%d = ",uVar66,uVar14 & 0xffffffff);
                  iVar26 = dill_type_of(s,uVar25);
                  dill_dump_reg(s,iVar26,iVar17);
                  printf("(%d) - ");
                }
                lVar30 = 0;
                do {
                  uVar25 = local_68[lVar30];
                  if (uVar25 == 0xffffffff) break;
                  uVar66 = 0x50;
                  if (99 < (int)uVar25) {
                    iVar26 = dill_type_of(s,uVar25);
                    uVar66 = (ulong)((uint)(iVar26 != 0xc) << 4 | 0x42);
                  }
                  printf(" %c%d = ",uVar66,(ulong)uVar25);
                  iVar26 = dill_type_of(s,uVar25);
                  dill_dump_reg(s,iVar26,*(int *)(local_ec + lVar30 * 4));
                  printf("(%d) - ");
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 3);
                putchar(10);
                pvVar51 = extraout_RDX_29;
                uVar25 = local_ec._28_4_;
              }
              switch(pvVar52->class_code) {
              case '\0':
                pp_Var62 = s->j->jmp_a3;
                pjVar38 = s->j->a3_data;
                goto LAB_0011071b;
              case '\x01':
                pjVar38 = s->j->a3i_data;
                (*s->j->jmp_a3i[local_ec._12_8_])
                          (s,(int)pjVar38[local_ec._12_8_].data1,(int)pjVar38[local_ec._12_8_].data2
                           ,iVar17,local_ec._0_4_,(pvVar52->opnds).spec.param);
                break;
              case '\x02':
                pjVar38 = s->j->a2_data;
                (*s->j->jmp_a2[local_ec._12_8_])
                          (s,(int)pjVar38[local_ec._12_8_].data1,(int)pjVar38[local_ec._12_8_].data2
                           ,iVar17,local_ec._0_4_);
                break;
              case '\x03':
                (*s->j->ret)(s,(int)pvVar52->insn_code,0,local_ec._0_4_);
                break;
              case '\x04':
                (*s->j->convert)(s,(uint)((byte)pvVar52->insn_code >> 4),
                                 (byte)pvVar52->insn_code & 0xf,iVar17,local_ec._0_4_);
                break;
              case '\x05':
                bVar47 = pvVar52->insn_code;
                uVar63 = bVar47 & 0xf;
                if ((bVar47 & 0x10) == 0) {
                  if ((bVar47 & 0x20) == 0) {
                    (*s->j->load)(s,uVar63,0,iVar17,local_ec._0_4_,local_ec._4_4_);
                  }
                  else {
                    (*s->j->bsload)(s,uVar63,0,iVar17,local_ec._0_4_,local_ec._4_4_);
                  }
                }
                else {
                  (*s->j->store)(s,uVar63,0,local_ec._8_4_,local_ec._0_4_,local_ec._4_4_);
                }
                break;
              case '\x06':
                bVar47 = pvVar52->insn_code;
                uVar63 = bVar47 & 0xf;
                if ((bVar47 & 0x10) == 0) {
                  lVar30 = (pvVar52->opnds).spec.param;
                  if ((bVar47 & 0x20) == 0) {
                    (*s->j->loadi)(s,uVar63,0,iVar17,local_ec._0_4_,lVar30);
                  }
                  else {
                    (*s->j->bsloadi)(s,uVar63,0,iVar17,local_ec._0_4_,lVar30);
                  }
                }
                else {
                  (*s->j->storei)(s,uVar63,0,local_ec._4_4_,local_ec._0_4_,
                                  (pvVar52->opnds).spec.param);
                }
                break;
              case '\a':
                (*s->j->set)(s,(byte)pvVar52->insn_code & 0xf,0,iVar17,(pvVar52->opnds).spec.param);
                break;
              case '\b':
                (*s->j->setf)(s,(byte)pvVar52->insn_code & 0xf,0,iVar17,(pvVar52->opnds).sf.imm);
                break;
              case '\t':
                pjVar39 = s->j;
                uVar63 = (byte)pvVar52->insn_code & 0xf;
                iVar26 = local_ec._0_4_;
LAB_00110880:
                (*pjVar39->mov)(s,uVar63,0,iVar17,iVar26);
                break;
              case '\n':
                (*s->j->reti)(s,(byte)pvVar52->insn_code & 0xf,0,(pvVar52->opnds).spec.param);
                break;
              case '\v':
                cVar2 = pvVar52->insn_code;
                iVar26 = piVar35[1];
                if (iVar26 != -1) {
                  piVar40 = local_b0;
                  do {
                    if (iVar26 == (pvVar52->opnds).a3.src2) {
                      iVar26 = piVar40[-2];
                      goto LAB_00110892;
                    }
                    iVar26 = *piVar40;
                    piVar40 = piVar40 + 3;
                  } while (iVar26 != -1);
                }
                puts("New label not found");
                iVar26 = -1;
LAB_00110892:
                pjVar38 = s->j->b_data;
                (*s->j->jmp_b[cVar2])
                          (s,(int)pjVar38[cVar2].data1,(int)pjVar38[cVar2].data2,local_ec._0_4_,
                           local_ec._4_4_,iVar26);
                goto LAB_001108ed;
              case '\f':
                cVar2 = pvVar52->insn_code;
                iVar26 = piVar35[1];
                if (iVar26 != -1) {
                  piVar40 = local_b0;
                  do {
                    if (iVar26 == (pvVar52->opnds).a3.src1) {
                      iVar26 = piVar40[-2];
                      goto LAB_001108c1;
                    }
                    iVar26 = *piVar40;
                    piVar40 = piVar40 + 3;
                  } while (iVar26 != -1);
                }
                puts("New label not found");
                iVar26 = -1;
LAB_001108c1:
                pjVar38 = s->j->b_data;
                (*s->j->jmp_bi[cVar2])
                          (s,(int)pjVar38[cVar2].data1,(int)pjVar38[cVar2].data2,local_ec._0_4_,
                           (pvVar52->opnds).bri.imm_l,iVar26);
LAB_001108ed:
                uVar25 = local_ec._28_4_;
                break;
              case '\r':
                iVar26 = piVar35[1];
                if (iVar26 != -1) {
                  piVar40 = local_b0;
                  do {
                    if (iVar26 == (pvVar52->opnds).a3.src2) {
                      uVar54 = (unsigned_long)piVar40[-2];
                      goto LAB_001108f7;
                    }
                    iVar26 = *piVar40;
                    piVar40 = piVar40 + 3;
                  } while (iVar26 != -1);
                }
                puts("New label not found");
                uVar54 = 0xffffffffffffffff;
LAB_001108f7:
                (*s->j->jv)(s,uVar54);
                break;
              case '\x0e':
                p_Var7 = s->j->special;
                if (p_Var7 != (special_op)0x0) {
                  (*p_Var7)(s,(pvVar52->opnds).spec.type,(pvVar52->opnds).spec.param);
                }
                break;
              case '\x0f':
                (*s->j->jp)(s,(long)(int)local_ec._0_4_);
                break;
              case '\x10':
                (*s->j->jpi)(s,(pvVar52->opnds).bri.imm_a);
                break;
              case '\x11':
                bVar47 = pvVar52->insn_code;
                if ((undefined1  [32])((undefined1  [32])pvVar52->opnds & (undefined1  [32])0x8000)
                    == (undefined1  [32])0x0) {
                  pjVar39 = s->j;
                  iVar26 = local_ec._0_4_;
                }
                else {
                  pushpop_inuse_regs(s,0,pvVar51);
                  pjVar39 = s->j;
                  iVar26 = (int)*(short *)&pvVar52->opnds;
                  uVar25 = local_ec._28_4_;
                }
                (*pjVar39->push)(s,bVar47 & 0xf,iVar26);
                break;
              case '\x12':
                if ((pvVar52->insn_code & 0xfU) == 8) {
                  (*s->j->pushpi)(s,8,(pvVar52->opnds).bri.imm_a);
                }
                else {
                  (*s->j->pushi)(s,4,(pvVar52->opnds).spec.param);
                }
                break;
              case '\x13':
                (*s->j->pushfi)(s,(byte)pvVar52->insn_code & 0xf,(pvVar52->opnds).sf.imm);
                break;
              case '\x14':
                uVar25 = (byte)pvVar52->insn_code & 0xf;
                if ((pvVar52->insn_code & 0x10U) == 0) {
                  iVar26 = (*s->j->calli)(s,uVar25,(pvVar52->opnds).bri.imm_a,
                                          (pvVar52->opnds).calli.xfer_name);
                  pvVar52 = extraout_RDX_30;
                }
                else {
                  iVar26 = (*s->j->callr)(s,uVar25,local_ec._0_4_);
                  pvVar52 = extraout_RDX_31;
                }
                local_a8.ret_reg = iVar26;
                uVar25 = local_ec._28_4_;
                local_a8.ret_vreg = local_ec._28_4_;
                pushpop_inuse_regs(s,1,pvVar52);
                break;
              case '\x15':
                lVar30 = (long)(int)local_68[0];
                if (lVar30 < 100) {
                  piVar40 = &s->p->c_param_args[lVar30].offset;
                }
                else {
                  piVar40 = &s->p->vregs[lVar30 + -100].offset;
                }
                lVar30 = (long)(pvVar52->opnds).a3.src2 + (long)*piVar40;
                pjVar39 = s->j;
                if ((int)lVar30 == 0) {
                  uVar63 = 8;
                  iVar26 = s->dill_local_pointer;
                  goto LAB_00110880;
                }
                (*pjVar39->jmp_a3i[0x28])
                          (s,(int)pjVar39->a3i_data[0x28].data1,(int)pjVar39->a3i_data[0x28].data2,
                           iVar17,s->dill_local_pointer,lVar30);
                break;
              case '\x16':
                pp_Var62 = s->j->jmp_c;
                pjVar38 = s->j->c_data;
LAB_0011071b:
                (*pp_Var62[local_ec._12_8_])
                          (s,(int)pjVar38[local_ec._12_8_].data1,(int)pjVar38[local_ec._12_8_].data2
                           ,iVar17,local_ec._0_4_,local_ec._4_4_);
              }
              if ((uVar25 != 0xffffffff) && (iVar17 == -1)) {
                if ((int)uVar25 < 100) {
                  uVar66 = (ulong)(int)uVar25;
                  piVar40 = &s->p->c_param_args[uVar66].offset;
                }
                else {
                  uVar66 = (ulong)uVar25;
                  piVar40 = &s->p->vregs[uVar66 - 100].offset;
                }
                iVar17 = *piVar40;
                iVar26 = dill_type_of(s,(int)uVar66);
                pdVar15 = local_a8.c;
                if ((int)uVar25 < 100) {
                  if ((local_a8.c)->p->c_param_args[uVar66].is_register == '\0') {
                    pvVar6 = local_a8.param_info + uVar66;
                    goto LAB_001109bb;
                  }
                }
                else {
                  pvVar6 = (local_a8.c)->p->vregs + ((ulong)uVar25 - 100);
LAB_001109bb:
                  (&pvVar6->update_in_reg)[1] = 1;
                  pvVar6->update_in_reg = 0;
                }
                if (iVar17 == -0x21524111) {
                  iVar17 = (*s->j->local)(s,0,iVar26);
                  s->p->vregs[uVar66 - 100].offset = iVar17;
                }
                uVar14 = local_ec._28_8_;
                p_Var11 = s->j->storei;
                if ((int)local_ec._28_4_ < 100) {
                  (*p_Var11)(s,iVar26,0,-1,s->dill_param_reg_pointer,(long)iVar17);
                  if (pdVar15->p->c_param_args[uVar66].is_register == '\0') {
                    pvVar6 = local_a8.param_info + uVar66;
                    goto LAB_00110aa0;
                  }
                }
                else {
                  (*p_Var11)(s,iVar26,0,-1,s->dill_local_pointer,(long)iVar17);
                  pvVar6 = pdVar15->p->vregs + ((uVar14 & 0xffffffff) - 100);
LAB_00110aa0:
                  pvVar6->in_reg = -1;
                }
                local_a8.ret_vreg = 0xffffffff;
              }
              pvVar50 = (virtual_insn *)&pvVar50->insn_code;
            } while (pvVar50 <= (undefined1 *)bb->end);
          }
          spill_current_pregs(&local_a8);
          uVar66 = local_50;
          if (count_verbose != 0) {
            uVar25 = (*s->j->count_insn)(s,(int)local_40,
                                         *(int *)&s->p->cur_ip - *(int *)&s->p->code_base);
            printf("Basic Block %zd, %d virtual instructions, %d physical instructions\n",uVar66,
                   (ulong)uVar19,(ulong)uVar25);
          }
          uVar66 = uVar66 + 1;
        } while (uVar66 < (ulong)(long)*(int *)(local_ec._20_8_ + 8));
      }
      lVar30 = (long)(int)uVar41;
      uVar19 = piVar35[lVar30 * 3];
      if ((long)pvVar50 * 0x28 == (ulong)uVar19) {
        dill_mark_label(s,piVar35[lVar30 * 3 + 2]);
        uVar41 = uVar41 + 1;
        lVar30 = (long)(int)uVar41;
        uVar19 = piVar35[lVar30 * 3];
      }
      if (uVar19 != 0xffffffff) {
        if (uVar19 == (int)pvVar50 * 0x28) {
          uVar41 = (uint)lVar30;
          puVar61 = (uint *)(piVar35 + lVar30 * 3);
          do {
            dill_mark_label(s,puVar61[2]);
            uVar25 = puVar61[3];
            uVar41 = uVar41 + 1;
            puVar61 = puVar61 + 3;
          } while (uVar25 == uVar19);
          uVar19 = uVar25;
          if (uVar25 == 0xffffffff) goto LAB_00110b8d;
        }
        printf("Some labels2 (%d, old loc %d name \"%s\") not placed\n",(ulong)uVar41,
               (long)(int)uVar19,(s->p->branch_table).label_name[(int)uVar19]);
      }
LAB_00110b8d:
      free(local_a8.fpregs);
      free(local_a8.ipregs);
      free(local_a8.param_info);
      iVar17 = local_6c;
    }
    else {
      iVar17 = dill_raw_getreg(s,(dill_reg *)&local_a8,6,1);
      if ((iVar17 == 0) || (iVar17 = dill_raw_getreg(s,(dill_reg *)local_68,6,1), iVar17 == 0)) {
        virtual_do_end_cold_1();
      }
      dill_raw_getreg(s,(dill_reg *)local_ec,10,1);
      dill_raw_getreg(s,(dill_reg *)&local_34,10,1);
      pdVar53 = s->p;
      lVar30 = 0x1e0;
      uVar41 = 0xfffffff7;
      do {
        prVar59 = &local_a8;
        prVar13 = (reg_state *)&pdVar53->machine_strr_tmp_reg;
        if (uVar41 < 2) {
          prVar59 = (reg_state *)local_ec;
          prVar13 = (reg_state *)local_ec;
        }
        puVar61 = local_68;
        if (uVar41 < 2) {
          puVar61 = &local_34;
        }
        *(dill_reg *)((long)pdVar53 + lVar30 + -8) = *(dill_reg *)&prVar59->c;
        *(uint *)((long)pdVar53 + lVar30 + -4) = *puVar61;
        *(dill_reg *)((long)&pdVar53->code_base + lVar30) = *(dill_reg *)&prVar13->c;
        lVar30 = lVar30 + 0xc;
        uVar41 = uVar41 + 1;
      } while (lVar30 != 0x270);
      if (0 < *(int *)((long)pmVar65 + 8)) {
        lVar30 = 0;
        do {
          pbVar28 = pmVar65->bblist;
          psVar37 = (short *)dill_malloc((long)pdVar53->vreg_count * 2);
          pbVar28[lVar30].reg_assigns = psVar37;
          memset(psVar37,0xff,(long)s->p->vreg_count * 2);
          foreach_bit(pbVar28[lVar30].regs_defined,do_reg_assign,pbVar28 + lVar30,s);
          pdVar53 = s->p;
          if (0 < pdVar53->vreg_count) {
            lVar32 = 0;
            lVar42 = 0;
            do {
              iVar17 = (int)pbVar28[lVar30].reg_assigns[lVar42];
              if (iVar17 != -1) {
                dill_raw_putreg(s,iVar17,*(int *)((long)&pdVar53->vregs->typ + lVar32));
                pdVar53 = s->p;
              }
              lVar42 = lVar42 + 1;
              lVar32 = lVar32 + 0x2c;
            } while (lVar42 < pdVar53->vreg_count);
          }
          lVar30 = lVar30 + 1;
          pmVar65 = (virtual_mach_info)local_ec._20_8_;
        } while (lVar30 < *(int *)(local_ec._20_8_ + 8));
      }
      if (0 < pdVar53->vreg_count) {
        uVar66 = (ulong)(iVar26 - 100);
        lVar30 = 8;
        uVar34 = 0;
        do {
          if (uVar66 == uVar34) {
            pvVar6 = pdVar53->vregs;
            pvVar6[uVar66].preg = s->dill_local_pointer;
            pvVar6[uVar66].offset = 0;
          }
          else {
            pvVar6 = pdVar53->vregs;
            iVar17 = *(int *)((long)pvVar6 + lVar30 + -8);
            if (iVar17 == 0xc) {
              iVar17 = *(int *)((long)&pvVar6->typ + lVar30);
              *(undefined4 *)((long)pvVar6 + lVar30 + -4) = 0xffffffff;
              iVar17 = (*s->j->local)(s,1,iVar17);
              pdVar53 = s->p;
              *(int *)((long)&pdVar53->vregs->typ + lVar30) = iVar17;
              pmVar65 = (virtual_mach_info)local_ec._20_8_;
            }
            else {
              *(undefined4 *)((long)pvVar6 + lVar30 + -4) = 0xffffffff;
              if (iVar17 == 0xb) {
                puts("internal void register error");
                pdVar53 = s->p;
              }
              else {
                iVar17 = (*s->j->local)(s,0,iVar17);
                pdVar53 = s->p;
                *(int *)((long)&pdVar53->vregs->typ + lVar30) = iVar17;
                pmVar65 = (virtual_mach_info)local_ec._20_8_;
              }
            }
          }
          uVar34 = uVar34 + 1;
          lVar30 = lVar30 + 0x2c;
        } while ((long)uVar34 < (long)pdVar53->vreg_count);
      }
      if (count_verbose == -1) {
        pcVar27 = getenv("DILL_COUNTS");
        count_verbose = (int)(pcVar27 != (char *)0x0);
      }
      if (pmVar65->bbcount == 0) {
        uVar66 = 0;
        uVar41 = 0;
      }
      else {
        local_48 = piVar35 + 4;
        uVar41 = 0;
        uVar66 = 0;
        do {
          pbVar31 = *(basic_block_conflict *)(local_ec._20_8_ + 0x10);
          pbVar28 = pbVar31 + uVar66;
          local_38 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
          local_b0 = (int *)CONCAT44(local_b0._4_4_,
                                     (int)pbVar31[uVar66].end - (int)pbVar31[uVar66].start);
          info_ptr = emit_getreg;
          local_50 = uVar66;
          foreach_bit(pbVar31[uVar66].regs_defined,emit_getreg,pbVar28,s);
          pvVar50 = (virtual_insn *)pbVar31[uVar66].start;
          local_40 = uVar66 * 0x68;
          if (pvVar50 <= (virtual_insn *)pbVar31[uVar66].end) {
            iVar17 = 0;
            pdVar53 = (private_ctx)0xffffffff;
            pvVar52 = extraout_RDX;
            do {
              iVar26 = (int)pvVar50 * 0x28;
              if ((iVar26 != 0) && (piVar35[(long)(int)uVar41 * 3] == iVar26)) {
                piVar40 = piVar35 + (long)(int)uVar41 * 3 + 3;
                do {
                  info_ptr = (code *)(ulong)(uint)piVar40[-1];
                  dill_mark_label(s,piVar40[-1]);
                  uVar41 = uVar41 + 1;
                  iVar18 = *piVar40;
                  pvVar52 = extraout_RDX_00;
                  piVar40 = piVar40 + 3;
                } while (iVar18 == iVar26);
              }
              pvVar51 = (virtual_insn *)(local_ec._36_8_ + pvVar50 * 0x28);
              if (s->dill_debug != 0) {
                printf("   v    ");
                virtual_print_insn(s,info_ptr,pvVar51);
                putchar(10);
                pvVar52 = extraout_RDX_01;
              }
              uVar19 = (uint)pdVar53;
              local_ec._28_8_ = pvVar50;
              switch(pvVar51->class_code) {
              case '\0':
                uVar25 = (pvVar51->opnds).a3.dest;
                iVar26 = (pvVar51->opnds).a3.src1;
                uVar63 = (pvVar51->opnds).a3.src2;
                iVar18 = (int)pvVar51->insn_code;
                local_ec._12_8_ = pdVar53;
                if ((uVar19 == uVar63) &&
                   (iVar23 = is_commutative(iVar18), uVar63 = uVar19, iVar23 != 0)) {
                  uVar63 = (pvVar51->opnds).a3.src1;
                  iVar26 = (pvVar51->opnds).a3.src2;
                }
                iVar23 = preg_of(s,pbVar28,uVar25);
                local_b8 = CONCAT44(local_b8._4_4_,iVar23);
                iVar23 = preg_of(s,pbVar28,iVar26);
                iVar24 = preg_of(s,pbVar28,uVar63);
                uVar14 = local_ec._12_8_;
                if (iVar23 == -1) {
                  iVar23 = (int)local_ec._12_8_;
                  if (iVar23 == iVar26) {
                    iVar21 = dill_type_of(s,iVar23);
                    pdVar53 = s->p;
                    if (pdVar53->v_tmps[iVar21][0] != -1) {
                      if (99 < iVar23) {
                        if ((pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.use_count == 1) &&
                           (pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                            pdVar53 = s->p;
                          }
                          pdVar53->cur_ip = pdVar53->code_base + iVar17;
                        }
                      }
                      iVar26 = dill_type_of(s,iVar23);
                      iVar23 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f3db;
                    }
                  }
                  iVar23 = load_oprnd(s,0,iVar26);
                }
LAB_0010f3db:
                if (iVar24 == -1) {
                  iVar24 = load_oprnd(s,1,uVar63);
                }
                iVar26 = (int)local_b8;
                if ((int)local_b8 == -1) {
                  pdVar53 = s->p;
                  iVar26 = dill_type_of(s,uVar25);
                  iVar26 = pdVar53->v_tmps[iVar26][0];
                }
                pjVar38 = s->j->a3_data;
                (*s->j->jmp_a3[iVar18])
                          (s,(int)pjVar38[iVar18].data1,(int)pjVar38[iVar18].data2,iVar26,iVar23,
                           iVar24);
                goto LAB_0010f8a4;
              case '\x01':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                lVar30 = (pvVar51->opnds).spec.param;
                iVar18 = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar63);
                cVar2 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  if (uVar19 == uVar63) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f470;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar63);
                }
LAB_0010f470:
                if (iVar18 == -1) {
                  pdVar53 = s->p;
                  iVar18 = dill_type_of(s,uVar25);
                  iVar18 = pdVar53->v_tmps[iVar18][0];
                }
                pjVar38 = s->j->a3i_data;
                (*s->j->jmp_a3i[cVar2])
                          (s,(int)pjVar38[cVar2].data1,(int)pjVar38[cVar2].data2,iVar18,iVar26,
                           lVar30);
                goto LAB_0010f8a4;
              case '\x02':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                iVar18 = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar63);
                cVar2 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  if (uVar19 == uVar63) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f32a;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar63);
                }
LAB_0010f32a:
                if (iVar18 == -1) {
                  pdVar53 = s->p;
                  iVar18 = dill_type_of(s,uVar25);
                  iVar18 = pdVar53->v_tmps[iVar18][0];
                }
                pjVar38 = s->j->a2_data;
                (*s->j->jmp_a2[cVar2])
                          (s,(int)pjVar38[cVar2].data1,(int)pjVar38[cVar2].data2,iVar18,iVar26);
                goto LAB_0010f8a4;
              case '\x03':
                uVar25 = (pvVar51->opnds).a3.dest;
                iVar26 = preg_of(s,pbVar28,uVar25);
                if (iVar26 == -1) {
                  if (uVar19 == uVar25) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f3a9;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar25);
                }
LAB_0010f3a9:
                info_ptr = (code *)(ulong)(uint)(int)pvVar51->insn_code;
                (*s->j->ret)(s,(int)pvVar51->insn_code,0,iVar26);
                pvVar52 = extraout_RDX_13;
                break;
              case '\x04':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                iVar18 = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar63);
                bVar47 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  if (uVar19 == uVar63) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f224;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar63);
                }
LAB_0010f224:
                if (iVar18 == -1) {
                  pdVar53 = s->p;
                  iVar18 = dill_type_of(s,uVar25);
                  iVar18 = pdVar53->v_tmps[iVar18][0];
                }
                (*s->j->convert)(s,(uint)(bVar47 >> 4),bVar47 & 0xf,iVar18,iVar26);
                goto LAB_0010f8a4;
              case '\x05':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                uVar64 = (pvVar51->opnds).a3.src2;
                bVar47 = pvVar51->insn_code;
                uVar12 = uVar63;
                if (uVar19 == uVar64) {
                  uVar12 = uVar64;
                  uVar64 = uVar63;
                }
                local_ec._12_8_ = pdVar53;
                iVar26 = preg_of(s,pbVar28,uVar25);
                local_b8 = CONCAT44(local_b8._4_4_,iVar26);
                iVar26 = preg_of(s,pbVar28,uVar12);
                local_bc = uVar64;
                iVar18 = preg_of(s,pbVar28,uVar64);
                uVar14 = local_ec._12_8_;
                if (iVar26 == -1) {
                  uVar19 = (uint)local_ec._12_8_;
                  if (uVar19 == uVar12) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar53 = s->p;
                    if (pdVar53->v_tmps[iVar26][0] != -1) {
                      if (99 < (int)uVar19) {
                        if ((pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.use_count == 1) &&
                           (pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                            pdVar53 = s->p;
                          }
                          pdVar53->cur_ip = pdVar53->code_base + iVar17;
                        }
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f4dc;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar12);
                }
LAB_0010f4dc:
                if (iVar18 == -1) {
                  iVar18 = load_oprnd(s,1,local_bc);
                }
                uVar19 = bVar47 & 0xf;
                if ((bVar47 & 0x10) != 0) {
                  iVar23 = (int)local_b8;
                  if ((int)local_b8 == -1) {
                    iVar23 = load_oprnd(s,2,uVar25);
                  }
                  info_ptr = (code *)(ulong)uVar19;
                  (*s->j->store)(s,uVar19,0,iVar23,iVar26,iVar18);
                  pvVar52 = extraout_RDX_14;
                  break;
                }
                iVar23 = (int)local_b8;
                if ((int)local_b8 == -1) {
                  local_ec._12_8_ = s->p;
                  iVar23 = dill_type_of(s,uVar25);
                  iVar23 = ((int (*) [3])(local_ec._12_8_ + 0x1d8))[iVar23][0];
                }
                (**(code **)((long)&s->j->load + (ulong)((bVar47 & 0x20) >> 2)))
                          (s,uVar19,0,iVar23,iVar26,iVar18);
                goto LAB_0010f8a4;
              case '\x06':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                lVar30 = (pvVar51->opnds).spec.param;
                iVar18 = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar63);
                bVar47 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  if (uVar19 == uVar63) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f652;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar63);
                }
LAB_0010f652:
                uVar19 = bVar47 & 0xf;
                if ((bVar47 & 0x10) != 0) {
                  if (iVar18 == -1) {
                    iVar18 = load_oprnd(s,1,uVar25);
                  }
                  info_ptr = (code *)(ulong)uVar19;
                  (*s->j->storei)(s,uVar19,0,iVar18,iVar26,lVar30);
                  pvVar52 = extraout_RDX_17;
                  break;
                }
                if (iVar18 == -1) {
                  pdVar53 = s->p;
                  iVar18 = dill_type_of(s,uVar25);
                  iVar18 = pdVar53->v_tmps[iVar18][0];
                }
                (**(code **)((long)&s->j->loadi + (ulong)((bVar47 & 0x20) >> 2)))
                          (s,uVar19,0,iVar18,iVar26,lVar30);
                goto LAB_0010f8a4;
              case '\a':
                uVar25 = (pvVar51->opnds).a3.dest;
                lVar30 = (pvVar51->opnds).spec.param;
                iVar26 = preg_of(s,pbVar28,uVar25);
                bVar47 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  pdVar53 = s->p;
                  iVar26 = dill_type_of(s,uVar25);
                  iVar26 = pdVar53->v_tmps[iVar26][0];
                }
                (*s->j->set)(s,bVar47 & 0xf,0,iVar26,lVar30);
                goto LAB_0010f5fe;
              case '\b':
                uVar25 = (pvVar51->opnds).a3.dest;
                local_ec._12_8_ = (pvVar51->opnds).sf.imm;
                iVar26 = preg_of(s,pbVar28,uVar25);
                bVar47 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  pdVar53 = s->p;
                  iVar26 = dill_type_of(s,uVar25);
                  iVar26 = pdVar53->v_tmps[iVar26][0];
                }
                (*s->j->setf)(s,bVar47 & 0xf,0,iVar26,(double)local_ec._12_8_);
                goto LAB_0010f5fe;
              case '\t':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                iVar18 = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar63);
                bVar47 = pvVar51->insn_code;
                if (iVar26 == -1) {
                  if (uVar19 == uVar63) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f2cb;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar63);
                }
LAB_0010f2cb:
                if (iVar18 == -1) {
                  pdVar53 = s->p;
                  iVar18 = dill_type_of(s,uVar25);
                  iVar18 = pdVar53->v_tmps[iVar18][0];
                }
                (*s->j->mov)(s,bVar47 & 0xf,0,iVar18,iVar26);
                goto LAB_0010f8a4;
              case '\n':
                uVar19 = (byte)pvVar51->insn_code & 0xf;
                info_ptr = (code *)(ulong)uVar19;
                (*s->j->reti)(s,uVar19,0,(pvVar51->opnds).spec.param);
                pvVar52 = extraout_RDX_06;
                break;
              case '\v':
                cVar2 = pvVar51->insn_code;
                iVar26 = piVar35[1];
                if (iVar26 != -1) {
                  piVar40 = local_48;
                  do {
                    if (iVar26 == (pvVar51->opnds).a3.src2) {
                      iVar26 = piVar40[-2];
                      local_ec._12_8_ = pdVar53;
                      goto LAB_0010efc9;
                    }
                    iVar26 = *piVar40;
                    piVar40 = piVar40 + 3;
                  } while (iVar26 != -1);
                }
                local_ec._12_8_ = pdVar53;
                puts("New label not found");
                iVar26 = -1;
LAB_0010efc9:
                iVar18 = (pvVar51->opnds).a3.dest;
                iVar23 = (pvVar51->opnds).a3.src1;
                iVar24 = preg_of(s,pbVar28,iVar18);
                iVar21 = preg_of(s,pbVar28,iVar23);
                uVar14 = local_ec._12_8_;
                if (iVar24 == -1) {
                  iVar24 = (int)local_ec._12_8_;
                  if (iVar24 == iVar18) {
                    iVar22 = dill_type_of(s,iVar24);
                    pdVar53 = s->p;
                    if (pdVar53->v_tmps[iVar22][0] != -1) {
                      if (99 < iVar24) {
                        if ((pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.use_count == 1) &&
                           (pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                            pdVar53 = s->p;
                          }
                          pdVar53->cur_ip = pdVar53->code_base + iVar17;
                        }
                      }
                      iVar18 = dill_type_of(s,iVar24);
                      iVar24 = s->p->v_tmps[iVar18][0];
                      goto LAB_0010f1ba;
                    }
                  }
                  iVar24 = load_oprnd(s,0,iVar18);
                }
LAB_0010f1ba:
                if (iVar21 == -1) {
                  iVar21 = load_oprnd(s,1,iVar23);
                }
                pjVar38 = s->j->b_data;
                uVar19 = (uint)pjVar38[cVar2].data1;
                info_ptr = (code *)(ulong)uVar19;
                (*s->j->jmp_b[cVar2])(s,uVar19,(int)pjVar38[cVar2].data2,iVar24,iVar21,iVar26);
                pvVar52 = extraout_RDX_10;
                break;
              case '\f':
                cVar2 = pvVar51->insn_code;
                iVar26 = piVar35[1];
                if (iVar26 != -1) {
                  piVar40 = local_48;
                  do {
                    if (iVar26 == (pvVar51->opnds).a3.src1) {
                      iVar26 = piVar40[-2];
                      goto LAB_0010f0be;
                    }
                    iVar26 = *piVar40;
                    piVar40 = piVar40 + 3;
                  } while (iVar26 != -1);
                }
                puts("New label not found");
                iVar26 = -1;
LAB_0010f0be:
                uVar25 = (pvVar51->opnds).a3.dest;
                lVar30 = (pvVar51->opnds).bri.imm_l;
                iVar18 = preg_of(s,pbVar28,uVar25);
                if (iVar18 == -1) {
                  if (uVar19 == uVar25) {
                    iVar18 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar18][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar18 = dill_type_of(s,uVar19);
                      iVar18 = s->p->v_tmps[iVar18][0];
                      goto LAB_0010f283;
                    }
                  }
                  iVar18 = load_oprnd(s,0,uVar25);
                }
LAB_0010f283:
                pjVar38 = s->j->b_data;
                uVar19 = (uint)pjVar38[cVar2].data1;
                info_ptr = (code *)(ulong)uVar19;
                (*s->j->jmp_bi[cVar2])(s,uVar19,(int)pjVar38[cVar2].data2,iVar18,lVar30,iVar26);
                pvVar52 = extraout_RDX_11;
                break;
              case '\r':
                iVar26 = piVar35[1];
                if (iVar26 != -1) {
                  piVar40 = local_48;
                  do {
                    if (iVar26 == (pvVar51->opnds).a3.src2) {
                      info_ptr = (code *)(long)piVar40[-2];
                      goto LAB_0010f197;
                    }
                    iVar26 = *piVar40;
                    piVar40 = piVar40 + 3;
                  } while (iVar26 != -1);
                }
                puts("New label not found");
                info_ptr = (code *)0xffffffffffffffff;
LAB_0010f197:
                (*s->j->jv)(s,(unsigned_long)info_ptr);
                pvVar52 = extraout_RDX_09;
                break;
              case '\x0e':
                p_Var7 = s->j->special;
                if (p_Var7 != (special_op)0x0) {
                  sVar4 = (pvVar51->opnds).spec.type;
                  info_ptr = (code *)(ulong)sVar4;
                  (*p_Var7)(s,sVar4,(pvVar51->opnds).spec.param);
                  pvVar52 = extraout_RDX_03;
                }
                goto switchD_0010e142_default;
              case '\x0f':
                uVar25 = (pvVar51->opnds).a3.dest;
                iVar26 = preg_of(s,pbVar28,uVar25);
                if (iVar26 == -1) {
                  if (uVar19 == uVar25) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f388;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar25);
                }
LAB_0010f388:
                info_ptr = (code *)(long)iVar26;
                (*s->j->jp)(s,(unsigned_long)info_ptr);
                pvVar52 = extraout_RDX_12;
                break;
              case '\x10':
                info_ptr = (code *)(pvVar51->opnds).bri.imm_a;
                (*s->j->jpi)(s,info_ptr);
                pvVar52 = extraout_RDX_02;
                break;
              case '\x11':
                bVar47 = pvVar51->insn_code;
                uVar25 = (pvVar51->opnds).a3.dest;
                if ((short)uVar25 < 0) {
                  pushpop_inuse_regs(s,0,pvVar52);
                  iVar26 = -1;
                }
                else {
                  iVar26 = preg_of(s,pbVar28,uVar25);
                  if (iVar26 == -1) {
                    if (uVar19 == uVar25) {
                      iVar26 = dill_type_of(s,uVar19);
                      pdVar46 = s->p;
                      if (pdVar46->v_tmps[iVar26][0] != -1) {
                        if (((99 < (int)uVar19) &&
                            (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count ==
                             1)) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                     def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                            pdVar46 = s->p;
                          }
                          pdVar46->cur_ip = pdVar46->code_base + iVar17;
                        }
                        iVar26 = dill_type_of(s,uVar19);
                        iVar26 = s->p->v_tmps[iVar26][0];
                        goto LAB_0010f8eb;
                      }
                    }
                    iVar26 = load_oprnd(s,0,uVar25);
                  }
                }
LAB_0010f8eb:
                uVar19 = bVar47 & 0xf;
                info_ptr = (code *)(ulong)uVar19;
                (*s->j->push)(s,uVar19,iVar26);
                pvVar52 = extraout_RDX_20;
                break;
              case '\x12':
                if ((pvVar51->insn_code & 0xfU) == 8) {
                  info_ptr = (code *)0x8;
                  (*s->j->pushpi)(s,8,(pvVar51->opnds).bri.imm_a);
                  pvVar52 = extraout_RDX_05;
                }
                else {
                  info_ptr = (code *)0x4;
                  (*s->j->pushi)(s,4,(pvVar51->opnds).spec.param);
                  pvVar52 = extraout_RDX_08;
                }
                break;
              case '\x13':
                uVar19 = (byte)pvVar51->insn_code & 0xf;
                info_ptr = (code *)(ulong)uVar19;
                (*s->j->pushfi)(s,uVar19,(pvVar51->opnds).sf.imm);
                pvVar52 = extraout_RDX_07;
                break;
              case '\x14':
                pbVar31 = (basic_block_conflict)
                          ((long)&(*(basic_block_conflict *)(local_ec._20_8_ + 0x10))[1].start +
                          local_40);
                uVar25 = (pvVar51->opnds).a3.dest;
                bVar47 = pvVar51->insn_code;
                uVar63 = bVar47 & 0xf;
                iVar26 = 0;
                if (uVar63 != 0xb) {
                  iVar26 = preg_of(s,pbVar31,uVar25);
                }
                if ((bVar47 & 0x10) == 0) {
                  iVar18 = (*s->j->calli)(s,uVar63,(pvVar51->opnds).bri.imm_a,
                                          (pvVar51->opnds).calli.xfer_name);
                  pvVar50 = extraout_RDX_04;
                }
                else {
                  lVar30 = (pvVar51->opnds).bri.imm_l;
                  iVar23 = (int)lVar30;
                  iVar18 = preg_of(s,pbVar28,iVar23);
                  if (iVar18 == -1) {
                    if (lVar30 == (int)uVar19) {
                      iVar18 = dill_type_of(s,uVar19);
                      pdVar53 = s->p;
                      if (pdVar53->v_tmps[iVar18][0] != -1) {
                        if (99 < iVar23) {
                          if ((pdVar53->vregs[(ulong)(uVar19 & 0x7fffffff) - 100].use_info.use_count
                               == 1) &&
                             (pdVar53->vregs[(ulong)(uVar19 & 0x7fffffff) - 100].use_info.def_count
                              == 1)) {
                            if (s->dill_debug != 0) {
                              puts(" -- Eliminating previous store -- ");
                              pdVar53 = s->p;
                            }
                            pdVar53->cur_ip = pdVar53->code_base + iVar17;
                          }
                        }
                        iVar18 = dill_type_of(s,uVar19);
                        iVar18 = s->p->v_tmps[iVar18][0];
                        goto LAB_0010f915;
                      }
                    }
                    iVar18 = load_oprnd(s,0,iVar23);
                  }
LAB_0010f915:
                  iVar18 = (*s->j->callr)(s,uVar63,iVar18);
                  pvVar50 = extraout_RDX_21;
                }
                if (uVar63 != 0xb) {
                  iVar23 = preg_of(s,pbVar31,uVar25);
                  if (iVar23 == -1) {
                    if ((int)uVar25 < 100) {
                      iVar23 = s->p->c_param_args[(int)uVar25].offset;
                      iVar24 = dill_type_of(s,uVar25);
                      pjVar39 = s->j;
                      iVar26 = s->dill_param_reg_pointer;
                    }
                    else {
                      iVar23 = s->p->vregs[(ulong)uVar25 - 100].offset;
                      iVar24 = dill_type_of(s,uVar25);
                      pjVar39 = s->j;
                      iVar26 = s->dill_local_pointer;
                    }
                    (*pjVar39->storei)(s,iVar24,0,iVar18,iVar26,(long)iVar23);
                    pvVar50 = extraout_RDX_23;
                  }
                  else {
                    (*s->j->mov)(s,uVar63,0,iVar26,iVar18);
                    pvVar50 = extraout_RDX_22;
                  }
                }
                info_ptr = (code *)0x1;
                pushpop_inuse_regs(s,1,pvVar50);
                pvVar52 = extraout_RDX_24;
                break;
              case '\x15':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                lVar30 = (pvVar51->opnds).spec.param;
                iVar18 = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar63);
                if (iVar26 == -1) {
                  if (uVar19 == uVar63) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar46 = s->p;
                    if (pdVar46->v_tmps[iVar26][0] != -1) {
                      if (((99 < (int)uVar19) &&
                          (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.use_count == 1
                          )) && (pdVar46->vregs[(long)(pdVar53[-1].v_tmps[6] + 1)].use_info.
                                 def_count == 1)) {
                        if (s->dill_debug != 0) {
                          puts(" -- Eliminating previous store -- ");
                          pdVar46 = s->p;
                        }
                        pdVar46->cur_ip = pdVar46->code_base + iVar17;
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f5b9;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar63);
                }
LAB_0010f5b9:
                if (iVar18 == -1) {
                  pdVar53 = s->p;
                  iVar18 = dill_type_of(s,uVar25);
                  iVar18 = pdVar53->v_tmps[iVar18][0];
                }
                (*s->j->lea)(s,0,0,iVar18,iVar26,lVar30);
LAB_0010f5fe:
                info_ptr = (code *)pbVar28;
                iVar26 = preg_of(s,pbVar28,uVar25);
                pdVar53 = (private_ctx)0xffffffff;
                pvVar52 = extraout_RDX_15;
                if (iVar26 == -1) {
                  iVar17 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
                  info_ptr = (code *)(ulong)uVar25;
                  store_oprnd(s,uVar25,(int)extraout_RDX_15);
                  pdVar53 = (private_ctx)(ulong)uVar25;
                  pvVar52 = extraout_RDX_16;
                }
                goto switchD_0010e142_default;
              case '\x16':
                uVar25 = (pvVar51->opnds).a3.dest;
                uVar63 = (pvVar51->opnds).a3.src1;
                uVar64 = (pvVar51->opnds).a3.src2;
                local_b8 = (long)pvVar51->insn_code;
                local_ec._12_8_ = pdVar53;
                uVar12 = uVar63;
                if ((uVar19 == uVar64) &&
                   ((uVar20 = (byte)pvVar51->insn_code - 4, 0x3d < uVar20 ||
                    ((uVar64 = uVar19, (0x7f0fe1fc3f800U >> ((ulong)uVar20 & 0x3f) & 1) == 0 &&
                     (uVar64 = uVar63, uVar12 = uVar19,
                     (0x3f8000000000007fU >> ((ulong)uVar20 & 0x3f) & 1) == 0)))))) {
                  puts("Unknown opcode in is_compare_commutative");
                  uVar64 = uVar19;
                  uVar12 = uVar63;
                }
                local_bc = preg_of(s,pbVar28,uVar25);
                iVar26 = preg_of(s,pbVar28,uVar12);
                iVar18 = preg_of(s,pbVar28,uVar64);
                uVar14 = local_ec._12_8_;
                if (iVar26 == -1) {
                  uVar19 = (uint)local_ec._12_8_;
                  if (uVar19 == uVar12) {
                    iVar26 = dill_type_of(s,uVar19);
                    pdVar53 = s->p;
                    if (pdVar53->v_tmps[iVar26][0] != -1) {
                      if (99 < (int)uVar19) {
                        if ((pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.use_count == 1) &&
                           (pdVar53->vregs[(uVar14 & 0xffffffff) - 100].use_info.def_count == 1)) {
                          if (s->dill_debug != 0) {
                            puts(" -- Eliminating previous store -- ");
                            pdVar53 = s->p;
                          }
                          pdVar53->cur_ip = pdVar53->code_base + iVar17;
                        }
                      }
                      iVar26 = dill_type_of(s,uVar19);
                      iVar26 = s->p->v_tmps[iVar26][0];
                      goto LAB_0010f822;
                    }
                  }
                  iVar26 = load_oprnd(s,0,uVar12);
                }
LAB_0010f822:
                if (iVar18 == -1) {
                  iVar18 = load_oprnd(s,1,uVar64);
                }
                uVar19 = local_bc;
                if (local_bc == 0xffffffff) {
                  pdVar53 = s->p;
                  iVar23 = dill_type_of(s,uVar25);
                  uVar19 = pdVar53->v_tmps[iVar23][0];
                }
                pjVar38 = s->j->c_data;
                (*s->j->jmp_c[local_b8])
                          (s,(int)pjVar38[local_b8].data1,(int)pjVar38[local_b8].data2,uVar19,iVar26
                           ,iVar18);
LAB_0010f8a4:
                info_ptr = (code *)pbVar28;
                iVar26 = preg_of(s,pbVar28,uVar25);
                pdVar53 = (private_ctx)0xffffffff;
                pvVar52 = extraout_RDX_18;
                if (iVar26 == -1) {
                  iVar17 = *(int *)&s->p->cur_ip - *(int *)&s->p->code_base;
                  info_ptr = (code *)(ulong)uVar25;
                  store_oprnd(s,uVar25,(int)extraout_RDX_18);
                  pdVar53 = (private_ctx)(ulong)uVar25;
                  pvVar52 = extraout_RDX_19;
                }
              default:
                goto switchD_0010e142_default;
              }
              pdVar53 = (private_ctx)0xffffffff;
switchD_0010e142_default:
              pvVar50 = (virtual_insn *)(local_ec._28_8_ + 1);
            } while (pvVar50 <= (undefined1 *)pbVar28->end);
          }
          foreach_bit(pbVar28->regs_defined,emit_putreg,pbVar28,s);
          uVar66 = local_50;
          if (count_verbose != 0) {
            uVar19 = (*s->j->count_insn)(s,local_38,*(int *)&s->p->cur_ip - *(int *)&s->p->code_base
                                        );
            printf("Basic Block %zd, %d virtual instructions, %d physical instructions\n",uVar66,
                   (ulong)local_b0 & 0xffffffff,(ulong)uVar19);
          }
          uVar66 = uVar66 + 1;
        } while (uVar66 < (ulong)(long)*(int *)(local_ec._20_8_ + 8));
        uVar66 = (long)pvVar50 * 0x28;
      }
      iVar17 = local_6c;
      uVar19 = piVar35[(long)(int)uVar41 * 3];
      if (uVar66 == uVar19) {
        dill_mark_label(s,piVar35[(long)(int)uVar41 * 3 + 2]);
        uVar41 = uVar41 + 1;
        uVar19 = piVar35[(long)(int)uVar41 * 3];
      }
      if (uVar19 != 0xffffffff) {
        printf("Some labels (%d, old loc %d) not placed\n",(ulong)uVar41);
      }
    }
    free_bbs((virtual_mach_info)local_ec._20_8_);
    free(piVar35);
    if (iVar17 == 0) {
      handle = dill_finalize(s);
      dill_free_handle(handle);
    }
    else {
      (*s->j->package_end)(s);
    }
    pdVar53 = s->p;
    s->j = (pdVar53->native).mach_jump;
    (pdVar53->native).mach_reset = pdVar53->mach_reset;
    (pdVar53->native).mach_info = pdVar53->mach_info;
    (pdVar53->native).code_base = pdVar53->code_base;
    pcVar27 = pdVar53->code_limit;
    (pdVar53->native).cur_ip = pdVar53->cur_ip;
    (pdVar53->native).code_limit = pcVar27;
    if (iVar17 == 0) {
      pdVar53->code_base = (char *)0x0;
    }
    pdVar53->mach_info = (void *)0x0;
  }
  else {
    free_bbs(pmVar65);
    pdVar53 = s->p;
  }
  pdVar53->mach_reset = dill_virtual_init;
LAB_0010dadb:
  if (virtual_do_end::dill_verbose != 0) {
    dill_dump(s);
  }
  return;
}

Assistant:

static void
virtual_do_end(dill_stream s, int package)
{
    static int no_optimize = -1;
    static int dill_verbose = -1;
    static int old_reg_alloc = -1;
    static int do_emulation = -1;

    virtual_mach_info vmi = (virtual_mach_info)s->p->mach_info;
    void* insns = s->p->code_base;
    void* code_end = s->p->cur_ip;
    void* prefix_begin =
        (char*)insns + (vmi->prefix_code_start * sizeof(virtual_insn));
    ;
    label_translation_table ltable;
    int virtual_local_pointer = s->dill_local_pointer;

    if (dill_verbose == -1) {
        dill_verbose = (getenv("DILL_VERBOSE") != NULL);
        no_optimize = (getenv("DILL_NOOPTIMIZE") != NULL);
        old_reg_alloc = (getenv("DILL_OLD_REGS") != NULL);
        do_emulation = (getenv("DILL_DO_EMULATION") != NULL);
#ifdef EMULATION_ONLY
        do_emulation = 1;
#endif
    }
    s->p->virtual.code_base = s->p->code_base;
    if (vmi->prefix_code_start == -1)
        prefix_begin = code_end;
    build_bbs(s, insns, prefix_begin, code_end);

    if (!no_optimize) {
        if (count_verbose == -1) {
            count_verbose = (getenv("DILL_COUNTS") != NULL);
        }
        if (count_verbose == 1) {
            printf("Prior to optimization, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        const_propagation(s, insns, vmi);
        if (count_verbose == 1) {
            printf("After constant propagation, %d non-null virtual insns\n",
                   virtual_insn_count(s));
        }
        CSE_elimination(s, insns, vmi);
        if (count_verbose == 1) {
            printf(
                "After duplicate instruction elimination (CSE-lite), %d "
                "non-null virtual insns\n",
                virtual_insn_count(s));
        }
        reset_use_def_count(s, insns, vmi);
        kill_dead_regs(s, insns, vmi);
    }

    if (dill_verbose) {
        dump_bbs(s);
        s->dill_debug = 1;
    }
    s->p->virtual.mach_jump = s->j;
    s->p->virtual.mach_reset = s->p->mach_reset;
    s->p->virtual.mach_info = s->p->mach_info;
    s->p->virtual.code_base = s->p->code_base;
    s->p->virtual.cur_ip = s->p->cur_ip;
    s->p->virtual.code_limit = s->p->code_limit;

    if (do_emulation) {
#ifdef BUILD_EMULATOR
        /* do a return, just in case it's missing */
        if (vmi->prefix_code_start == -1) {
            dill_retii(s, 0);
            s->p->virtual.cur_ip = s->p->cur_ip;
	    s->p->virtual.code_base = s->p->code_base;
	    s->p->virtual.code_limit = s->p->code_limit;
        }
        setup_VM_proc(s);
#endif
        free_bbs(vmi);
        s->p->mach_reset = dill_virtual_init;
    } else if (dill_foreign_cg) {
        (dill_foreign_cg)(s, (virtual_insn*)s->p->code_base,
                          (virtual_insn*)s->p->cur_ip);
    } else {
        s->j = s->p->native.mach_jump;
        s->p->mach_reset = s->p->native.mach_reset;
        s->p->mach_info = s->p->native.mach_info;
        s->p->code_base = s->p->native.code_base;
        s->p->native.code_base = NULL;
        s->p->native.mach_info = NULL;
        if (s->p->code_base == NULL) {
            init_code_block(s);
            s->p->native.code_base = s->p->code_base;
            s->p->native.code_limit = s->p->code_limit;
        }
        s->p->cur_ip = s->p->code_base;
        s->p->code_limit = s->p->native.code_limit;

        s->p->native_mach_reset(s);
        ltable = build_label_translation(s);
        (s->j->proc_start)(s, "no name", s->p->c_param_count, vmi->arg_info,
                           (void*)0);
        fill_label_translation(s, ltable);
        if (old_reg_alloc) {
            do_register_assign(s, insns, code_end, virtual_local_pointer, vmi);
            emit_insns(s, insns, ltable, vmi);
        } else {
            new_emit_insns(s, insns, ltable, vmi);
        }
        free_bbs(vmi);
        free(ltable);
        if (package) {
            s->j->package_end(s);
        } else {
            dill_exec_handle h;
            h = dill_finalize(s);
            dill_free_handle(h);
        }
        s->j = s->p->native.mach_jump;
        s->p->native.mach_reset = s->p->mach_reset;
        s->p->native.mach_info = s->p->mach_info;
        s->p->native.code_base = s->p->code_base;
        s->p->native.cur_ip = s->p->cur_ip;
        s->p->native.code_limit = s->p->code_limit;
        if (!package)
            s->p->code_base = NULL;
        s->p->mach_info = NULL;
        s->p->mach_reset = dill_virtual_init;
    }
    if (dill_verbose) {
        dill_dump(s);
    }
}